

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicInputIBase::Setup(BasicInputIBase *this)

{
  uint *puVar1;
  long lVar2;
  Vector<unsigned_int,_4> local_30;
  
  this->m_po = 0;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_xfbo);
  for (lVar2 = -0x200; lVar2 != 0; lVar2 = lVar2 + 0x10) {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_30,0);
    puVar1 = (uint *)((long)this->expected_dataui[0].m_data + lVar2);
    *(undefined8 *)puVar1 = local_30.m_data._0_8_;
    *(undefined8 *)(puVar1 + 2) = local_30.m_data._8_8_;
    tcu::Vector<unsigned_int,_4>::Vector(&local_30,0);
    puVar1 = (uint *)((long)&this->instance_count + lVar2);
    *(undefined8 *)puVar1 = local_30.m_data._0_8_;
    *(undefined8 *)(puVar1 + 2) = local_30.m_data._8_8_;
  }
  this->instance_count = 1;
  this->base_instance = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_po = 0;
		glGenBuffers(1, &m_xfbo);
		for (int i = 0; i < 32; ++i)
		{
			expected_datai[i]  = IVec4(0);
			expected_dataui[i] = UVec4(0);
		}
		instance_count = 1;
		base_instance  = 0;
		return NO_ERROR;
	}